

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap0_validate(FT_Byte *table,FT_Validator valid)

{
  uint local_28;
  FT_UInt idx;
  FT_UInt n;
  FT_UInt length;
  FT_Byte *p;
  FT_Validator valid_local;
  FT_Byte *table_local;
  
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  if ((valid->limit < table + (uint)CONCAT11(table[2],table[3])) ||
     (CONCAT11(table[2],table[3]) < 0x106)) {
    ft_validator_error(valid,8);
  }
  if (valid->level != FT_VALIDATE_DEFAULT) {
    _n = table + 6;
    for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
      if ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)*_n) {
        ft_validator_error(valid,0x10);
      }
      _n = _n + 1;
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap0_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    if ( table + length > valid->limit || length < 262 )
      FT_INVALID_TOO_SHORT;

    /* check glyph indices whenever necessary */
    if ( valid->level >= FT_VALIDATE_TIGHT )
    {
      FT_UInt  n, idx;


      p = table + 6;
      for ( n = 0; n < 256; n++ )
      {
        idx = *p++;
        if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
          FT_INVALID_GLYPH_ID;
      }
    }

    return FT_Err_Ok;
  }